

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

ForContainer<std::set<int>,_std::string> * __thiscall
lest::to_string<std::set<int,std::less<int>,std::allocator<int>>>
          (ForContainer<std::set<int>,_std::string> *__return_storage_ptr__,lest *this,
          set<int,_std::less<int>,_std::allocator<int>_> *cont)

{
  ForContainer<std::set<int>,_std::string> *pFVar1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  ostringstream os;
  _Rb_tree_color local_1d4;
  string local_1d0;
  ForContainer<std::set<int>,_std::string> *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{ ",2);
  p_Var3 = *(_Rb_tree_node_base **)(this + 0x18);
  local_1b0 = __return_storage_ptr__;
  if (p_Var3 != (_Rb_tree_node_base *)(this + 8)) {
    do {
      local_1d4 = p_Var3[1]._M_color;
      make_value_string<int>(&local_1d0,(int *)&local_1d4);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != (_Rb_tree_node_base *)(this + 8));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
  pFVar1 = local_1b0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return pFVar1;
}

Assistant:

auto to_string( C const & cont ) -> ForContainer<C, std::string>
{
    std::ostringstream os;
    os << "{ ";
    for ( auto & x : cont )
    {
        os << to_string( x ) << ", ";
    }
    os << "}";
    return os.str();
}